

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O3

int jpc_ns_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  jpc_fix_t *pjVar7;
  jpc_fix_t *pjVar8;
  uint uVar9;
  long *plVar10;
  jpc_fix_t *pjVar11;
  jpc_fix_t *pjVar12;
  uint uVar13;
  jpc_fix_t *pjVar14;
  uint uVar15;
  long *plVar17;
  jpc_fix_t *pjVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  uint n;
  uint uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  ulong uVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint llen;
  jpc_fix_t *local_68;
  ulong uVar16;
  
  if (height != 0) {
    uVar13 = xstart & 1;
    uVar2 = (uVar13 ^ 1) + width;
    uVar15 = uVar2 >> 1;
    uVar16 = (ulong)uVar15;
    uVar20 = uVar15 - (uVar13 == 0);
    uVar23 = width & 1;
    uVar3 = (uint)(uVar23 == uVar13);
    uVar9 = (uint)(uVar23 != uVar13);
    uVar25 = (width - uVar15) - uVar13;
    iVar24 = (uVar9 - uVar15) + (uint)(uVar13 == 0);
    pjVar8 = a + uVar16;
    iVar26 = 0;
    pjVar14 = a;
    do {
      if (1 < (uint)width) {
        if (1 < uVar2) {
          lVar4 = 0;
          do {
            pjVar14[lVar4] = pjVar14[lVar4] * 0x275d >> 0xd;
            lVar4 = lVar4 + 1;
          } while (uVar15 != (uint)lVar4);
        }
        uVar5 = uVar16;
        if (width - uVar15 != 0) {
          do {
            pjVar14[uVar5] = pjVar14[uVar5] * 0x3406 >> 0xd;
            uVar5 = uVar5 + 1;
          } while (width != (int)uVar5);
        }
        plVar6 = pjVar14 + uVar16;
        plVar10 = pjVar14;
        if (uVar13 == 0) {
          *pjVar14 = *pjVar14 - (*plVar6 * 0x1c62 >> 0xd);
          plVar10 = pjVar14 + 1;
        }
        plVar17 = plVar6;
        if (uVar20 != uVar9) {
          lVar22 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] = plVar10[lVar4] - ((pjVar8[lVar4 + 1] + pjVar8[lVar4]) * 0xe31 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar22 = lVar22 + -8;
          } while ((int)lVar4 + iVar24 != 0);
          plVar10 = (long *)((long)plVar10 - lVar22);
          plVar17 = (long *)((long)pjVar8 - lVar22);
        }
        if (uVar23 != uVar13) {
          *plVar10 = *plVar10 - (*plVar17 * 0x1c62 >> 0xd);
        }
        plVar10 = plVar6;
        if (uVar13 != 0) {
          *plVar6 = *plVar6 - (*pjVar14 * 0x3881 >> 0xd);
          plVar10 = plVar6 + 1;
        }
        plVar17 = pjVar14;
        if (uVar25 != uVar3) {
          lVar22 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] =
                 plVar10[lVar4] - ((pjVar14[lVar4 + 1] + pjVar14[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar22 = lVar22 + -8;
          } while (uVar25 - uVar3 != (int)lVar4);
          plVar10 = (long *)((long)plVar10 - lVar22);
          plVar17 = (long *)((long)pjVar14 - lVar22);
        }
        if (uVar23 == uVar13) {
          *plVar10 = *plVar10 - (*plVar17 * 0x3881 >> 0xd);
        }
        plVar10 = pjVar14;
        if (uVar13 == 0) {
          *pjVar14 = *pjVar14 - (*plVar6 * -0x364 >> 0xd);
          plVar10 = pjVar14 + 1;
        }
        plVar17 = plVar6;
        if (uVar20 != uVar9) {
          lVar22 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] = plVar10[lVar4] - ((pjVar8[lVar4 + 1] + pjVar8[lVar4]) * -0x1b2 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar22 = lVar22 + -8;
          } while ((int)lVar4 + iVar24 != 0);
          plVar10 = (long *)((long)plVar10 - lVar22);
          plVar17 = (long *)((long)pjVar8 - lVar22);
        }
        if (uVar23 != uVar13) {
          *plVar10 = *plVar10 - (*plVar17 * -0x364 >> 0xd);
        }
        if (uVar13 != 0) {
          *plVar6 = *plVar6 - (*pjVar14 * -0x6583 >> 0xd);
          plVar6 = plVar6 + 1;
        }
        plVar10 = pjVar14;
        if (uVar25 != uVar3) {
          lVar4 = 0;
          lVar22 = 0;
          do {
            plVar6[lVar22] =
                 plVar6[lVar22] - ((pjVar14[lVar22 + 1] + pjVar14[lVar22]) * -0x32c1 >> 0xd);
            lVar22 = lVar22 + 1;
            lVar4 = lVar4 + -8;
          } while (uVar25 - uVar3 != (int)lVar22);
          plVar6 = (long *)((long)plVar6 - lVar4);
          plVar10 = (long *)((long)pjVar14 - lVar4);
        }
        if (uVar23 == uVar13) {
          *plVar6 = *plVar6 - (*plVar10 * -0x6583 >> 0xd);
        }
      }
      jpc_qmfb_join_row(pjVar14,width,uVar13);
      pjVar14 = pjVar14 + stride;
      iVar26 = iVar26 + 1;
      pjVar8 = pjVar8 + stride;
    } while (iVar26 != height);
  }
  uVar2 = ystart & 1;
  uVar3 = width & 0xfffffff0;
  if (uVar3 != 0) {
    uVar13 = (height - uVar2) + 1;
    uVar15 = uVar13 >> 1;
    uVar16 = (ulong)(uVar15 * stride);
    iVar24 = height - uVar15;
    uVar20 = height & 1;
    iVar21 = (uVar15 - (uVar2 == 0)) - (uint)(uVar20 != uVar2);
    iVar26 = (iVar24 - uVar2) - (uint)(uVar20 == uVar2);
    pjVar8 = a + uVar16;
    pjVar14 = a + (uint)stride + uVar16;
    local_68 = a + (uint)stride;
    uVar23 = 0;
    do {
      if (1 < (uint)height) {
        pjVar7 = a;
        uVar9 = uVar15;
        iVar19 = iVar24;
        pjVar11 = pjVar8;
        if (1 < uVar13) {
          do {
            lVar4 = 0;
            do {
              pjVar7[lVar4] = pjVar7[lVar4] * 0x275d >> 0xd;
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 0x10);
            uVar9 = uVar9 - 1;
            pjVar7 = pjVar7 + (uint)stride;
          } while (uVar9 != 0);
        }
        for (; iVar19 != 0; iVar19 = iVar19 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] * 0x3406 >> 0xd;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
        }
        pjVar11 = a;
        if (uVar2 == 0) {
          lVar4 = 0;
          do {
            lVar22 = (a + lVar4)[1];
            uVar5 = a[uVar16 + lVar4];
            uVar31 = (a + uVar16 + lVar4)[1];
            uVar5 = ((uVar5 >> 0x20) * 0x1c62 << 0x20) + (uVar5 & 0xffffffff) * 0x1c62;
            uVar31 = ((uVar31 >> 0x20) * 0x1c62 << 0x20) + (uVar31 & 0xffffffff) * 0x1c62;
            auVar29._0_4_ = (undefined4)(uVar5 >> 0xd);
            auVar29._8_4_ = (undefined4)(uVar31 >> 0xd);
            auVar29._4_4_ = auVar29._8_4_;
            auVar29._12_4_ = (int)((long)uVar31 >> 0x2d);
            a[lVar4] = a[lVar4] - CONCAT44((int)((long)uVar5 >> 0x2d),auVar29._0_4_);
            (a + lVar4)[1] = lVar22 - auVar29._8_8_;
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0x10);
          pjVar11 = a + (uint)stride;
        }
        pjVar7 = a + uVar16;
        pjVar12 = pjVar7;
        pjVar18 = pjVar14;
        pjVar1 = pjVar8;
        for (iVar19 = iVar21; iVar19 != 0; iVar19 = iVar19 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar18[lVar4] + pjVar1[lVar4]) * 0xe31 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
          pjVar12 = pjVar1 + (uint)stride;
          pjVar18 = pjVar18 + (uint)stride;
          pjVar1 = pjVar12;
        }
        if (uVar20 != uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar12[lVar4] * 0x1c62 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar19 = iVar26;
        pjVar11 = pjVar7;
        pjVar12 = a;
        pjVar18 = local_68;
        if (uVar2 != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar7 + (uint)stride;
        }
        for (; iVar19 != 0; iVar19 = iVar19 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar18[lVar4] + pjVar12[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
          pjVar12 = pjVar12 + (uint)stride;
          pjVar18 = pjVar18 + (uint)stride;
        }
        if (uVar20 == uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar12[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar19 = iVar21;
        pjVar12 = pjVar7;
        pjVar11 = a;
        pjVar18 = pjVar14;
        pjVar1 = pjVar8;
        if (uVar2 == 0) {
          lVar4 = 0;
          do {
            lVar22 = (a + lVar4)[1];
            uVar5 = a[uVar16 + lVar4];
            uVar31 = (a + uVar16 + lVar4)[1];
            uVar5 = (uVar5 & 0xffffffff) * 0xfffffc9c +
                    ((uVar5 & 0xffffffff) * 0xffffffff + (uVar5 >> 0x20) * 0xfffffc9c << 0x20);
            uVar31 = (uVar31 & 0xffffffff) * 0xfffffc9c +
                     ((uVar31 & 0xffffffff) * 0xffffffff + (uVar31 >> 0x20) * 0xfffffc9c << 0x20);
            auVar30._0_4_ = (undefined4)(uVar5 >> 0xd);
            auVar30._8_4_ = (undefined4)(uVar31 >> 0xd);
            auVar30._4_4_ = auVar30._8_4_;
            auVar30._12_4_ = (int)((long)uVar31 >> 0x2d);
            a[lVar4] = a[lVar4] - CONCAT44((int)((long)uVar5 >> 0x2d),auVar30._0_4_);
            (a + lVar4)[1] = lVar22 - auVar30._8_8_;
            lVar4 = lVar4 + 2;
          } while (lVar4 != 0x10);
          pjVar11 = a + (uint)stride;
        }
        for (; iVar19 != 0; iVar19 = iVar19 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar18[lVar4] + pjVar1[lVar4]) * -0x1b2 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar12 = pjVar1 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar18 = pjVar18 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
        }
        if (uVar20 != uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar12[lVar4] * -0x364 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar19 = iVar26;
        pjVar11 = a;
        pjVar12 = local_68;
        if (uVar2 != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar7 = pjVar7 + (uint)stride;
        }
        for (; iVar19 != 0; iVar19 = iVar19 + -1) {
          lVar4 = 0;
          do {
            pjVar7[lVar4] = pjVar7[lVar4] - ((pjVar12[lVar4] + pjVar11[lVar4]) * -0x32c1 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar7 = pjVar7 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar12 = pjVar12 + (uint)stride;
        }
        if (uVar20 == uVar2) {
          lVar4 = 0;
          do {
            pjVar7[lVar4] = pjVar7[lVar4] - (pjVar11[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
      }
      jpc_qmfb_join_colgrp(a,height,stride,uVar2);
      a = a + 0x10;
      uVar23 = uVar23 + 0x10;
      pjVar8 = pjVar8 + 0x10;
      pjVar14 = pjVar14 + 0x10;
      local_68 = local_68 + 0x10;
    } while (uVar23 < uVar3);
  }
  if (uVar3 != width) {
    uVar3 = width & 0xf;
    if (1 < (uint)height) {
      uVar13 = (uVar2 ^ 1) + height;
      uVar15 = uVar13 >> 1;
      if (1 < uVar13) {
        pjVar8 = a;
        uVar13 = uVar15;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar8[lVar4] = pjVar8[lVar4] * 0x275d >> 0xd;
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar8 = pjVar8 + (uint)stride;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar16 = (ulong)(uVar15 * stride);
      pjVar8 = a + uVar16;
      iVar24 = height - uVar15;
      if (iVar24 != 0) {
        pjVar14 = pjVar8;
        iVar26 = iVar24;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar14[lVar4] = pjVar14[lVar4] * 0x3406 >> 0xd;
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar14 = pjVar14 + (uint)stride;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      pjVar14 = a;
      if (uVar2 == 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * 0x1c62 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar14 = a + (uint)stride;
      }
      uVar13 = height & 1;
      iVar26 = (uVar15 - (uVar2 == 0)) - (uint)(uVar13 != uVar2);
      pjVar11 = pjVar8;
      if (iVar26 != 0) {
        pjVar7 = a + (uint)stride + uVar16;
        iVar21 = iVar26;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar14[lVar4] = pjVar14[lVar4] - ((pjVar7[lVar4] + pjVar11[lVar4]) * 0xe31 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar14 = pjVar14 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      bVar27 = (width & 0xfU) != 0;
      if (bVar27 && uVar13 != uVar2) {
        lVar4 = 0;
        do {
          pjVar14[lVar4] = pjVar14[lVar4] - (pjVar11[lVar4] * 0x1c62 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      pjVar14 = pjVar8;
      if (uVar2 != 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar14 = pjVar8 + (uint)stride;
      }
      iVar21 = (iVar24 - uVar2) - (uint)(uVar13 == uVar2);
      pjVar11 = a;
      pjVar7 = a;
      for (iVar24 = iVar21; iVar24 != 0; iVar24 = iVar24 + -1) {
        pjVar7 = pjVar7 + (uint)stride;
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar14[lVar4] = pjVar14[lVar4] - ((pjVar7[lVar4] + pjVar11[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar14 = pjVar14 + (uint)stride;
        pjVar11 = pjVar11 + (uint)stride;
      }
      bVar28 = (width & 0xfU) != 0;
      if (bVar28 && uVar13 == uVar2) {
        lVar4 = 0;
        do {
          pjVar14[lVar4] = pjVar14[lVar4] - (pjVar11[lVar4] * 0x3881 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      pjVar14 = a;
      if (uVar2 == 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * -0x364 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar14 = a + (uint)stride;
      }
      pjVar11 = pjVar8;
      if (iVar26 != 0) {
        pjVar7 = a + (uint)stride + uVar16;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar14[lVar4] = pjVar14[lVar4] - ((pjVar7[lVar4] + pjVar11[lVar4]) * -0x1b2 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar14 = pjVar14 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      if (bVar27 && uVar13 != uVar2) {
        lVar4 = 0;
        do {
          pjVar14[lVar4] = pjVar14[lVar4] - (pjVar11[lVar4] * -0x364 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      if (uVar2 != 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar8 = pjVar8 + (uint)stride;
      }
      pjVar14 = a;
      if (iVar21 != 0) {
        pjVar11 = a;
        do {
          pjVar11 = pjVar11 + (uint)stride;
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar8[lVar4] = pjVar8[lVar4] - ((pjVar11[lVar4] + pjVar14[lVar4]) * -0x32c1 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar8 = pjVar8 + (uint)stride;
          pjVar14 = pjVar14 + (uint)stride;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      if (bVar28 && uVar13 == uVar2) {
        lVar4 = 0;
        do {
          pjVar8[lVar4] = pjVar8[lVar4] - (pjVar14[lVar4] * -0x6583 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
    }
    jpc_qmfb_join_colres(a,height,uVar3,stride,uVar2);
  }
  return 0;
}

Assistant:

int jpc_ns_synthesize(jpc_fix_t *a, int xstart, int ystart, int width,
  int height, int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ns_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ns_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ns_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}